

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O0

void __thiscall google::protobuf::internal::Mutex::Unlock(Mutex *this)

{
  LogMessage *pLVar1;
  char *value;
  LogFinisher local_5d [13];
  LogMessage local_50;
  int local_14;
  Mutex *pMStack_10;
  int result;
  Mutex *this_local;
  
  pMStack_10 = this;
  local_14 = pthread_mutex_unlock((pthread_mutex_t *)this->mInternal);
  if (local_14 != 0) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/common.cc"
               ,0x180);
    pLVar1 = LogMessage::operator<<(&local_50,"pthread_mutex_unlock: ");
    value = strerror(local_14);
    pLVar1 = LogMessage::operator<<(pLVar1,value);
    LogFinisher::operator=(local_5d,pLVar1);
    LogMessage::~LogMessage(&local_50);
  }
  return;
}

Assistant:

void Mutex::Unlock() {
  int result = pthread_mutex_unlock(&mInternal->mutex);
  if (result != 0) {
    GOOGLE_LOG(FATAL) << "pthread_mutex_unlock: " << strerror(result);
  }
}